

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode Int32_encodeBinary(UA_Int32 *src)

{
  UA_StatusCode UVar1;
  
  UVar1 = 0x80080000;
  if (pos + 4 <= end) {
    *(UA_Int32 *)pos = *src;
    pos = pos + 4;
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
UInt32_encodeBinary(UA_UInt32 const *src, const UA_DataType *_) {
    if(pos + sizeof(UA_UInt32) > end)
        return UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED;
#if UA_BINARY_OVERLAYABLE_INTEGER
    memcpy(pos, src, sizeof(UA_UInt32));
#else
    UA_encode32(*src, pos);
#endif
    pos += 4;
    return UA_STATUSCODE_GOOD;
}